

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BBoxRenderCase::BBoxRenderCase
          (BBoxRenderCase *this,Context *context,char *name,char *description,int numIterations,
          deUint32 flags)

{
  BBoxSize local_54;
  byte local_30;
  deUint32 flags_local;
  int numIterations_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  BBoxRenderCase *this_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BBoxRenderCase_032cfbf8;
  this->m_renderTarget = (uint)((flags & 1) == 0);
  if ((flags & 4) == 0) {
    local_54 = BBOXSIZE_LARGER;
    if ((flags & 0x10) != 0) {
      local_54 = BBOXSIZE_SMALLER;
    }
  }
  else {
    local_54 = BBOXSIZE_EQUAL;
  }
  this->m_bboxSize = local_54;
  this->m_hasTessellationStage = SUB41((flags & 0x20) >> 5,0);
  this->m_hasGeometryStage = SUB41((flags & 0x40) >> 6,0);
  local_30 = (byte)flags;
  this->m_useGlobalState = (bool)(local_30 >> 7);
  this->m_calcPerPrimitiveBBox = (bool)((byte)(flags >> 9) & 1);
  this->m_numIterations = numIterations;
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::MovePtr
            (&this->m_program);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::MovePtr(&this->m_vbo);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::MovePtr(&this->m_fbo);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
  ::vector(&this->m_iterationConfigs);
  this->m_iteration = 0;
  return;
}

Assistant:

BBoxRenderCase::BBoxRenderCase (Context& context, const char* name, const char* description, int numIterations, deUint32 flags)
	: TestCase					(context, name, description)
	, m_renderTarget			((flags & FLAG_RENDERTARGET_DEFAULT) ? (RENDERTARGET_DEFAULT) : (RENDERTARGET_FBO))
	, m_bboxSize				((flags & FLAG_BBOXSIZE_EQUAL) ? (BBOXSIZE_EQUAL) : (flags & FLAG_BBOXSIZE_SMALLER) ? (BBOXSIZE_SMALLER) : (BBOXSIZE_LARGER))
	, m_hasTessellationStage	((flags & FLAG_TESSELLATION) != 0)
	, m_hasGeometryStage		((flags & FLAG_GEOMETRY) != 0)
	, m_useGlobalState			((flags & FLAG_SET_BBOX_STATE) != 0)
	, m_calcPerPrimitiveBBox	((flags & FLAG_PER_PRIMITIVE_BBOX) != 0)
	, m_numIterations			(numIterations)
	, m_iteration				(0)
{
	// validate flags
	DE_ASSERT((((m_renderTarget == RENDERTARGET_DEFAULT)	?	(FLAG_RENDERTARGET_DEFAULT)	: (0)) |
			   ((m_renderTarget == RENDERTARGET_FBO)		?	(FLAG_RENDERTARGET_FBO)		: (0)) |
			   ((m_bboxSize == BBOXSIZE_EQUAL)				?	(FLAG_BBOXSIZE_EQUAL)		: (0)) |
			   ((m_bboxSize == BBOXSIZE_LARGER)				?	(FLAG_BBOXSIZE_LARGER)		: (0)) |
			   ((m_bboxSize == BBOXSIZE_SMALLER)			?	(FLAG_BBOXSIZE_SMALLER)		: (0)) |
			   ((m_hasTessellationStage)					?	(FLAG_TESSELLATION)			: (0)) |
			   ((m_hasGeometryStage)						?	(FLAG_GEOMETRY)				: (0)) |
			   ((m_useGlobalState)							?	(FLAG_SET_BBOX_STATE)		: (0)) |
			   ((!m_useGlobalState)							?	(FLAG_SET_BBOX_OUTPUT)		: (0)) |
			   ((m_calcPerPrimitiveBBox)					?	(FLAG_PER_PRIMITIVE_BBOX)	: (0))) == (flags & ((1u << FLAGBIT_USER_BIT) - 1)));

	DE_ASSERT(m_useGlobalState || m_hasTessellationStage); // using non-global state requires tessellation

	if (m_calcPerPrimitiveBBox)
	{
		DE_ASSERT(!m_useGlobalState); // per-primitive test requires per-primitive (non-global) state
		DE_ASSERT(m_bboxSize == BBOXSIZE_EQUAL); // smaller is hard to verify, larger not interesting
	}
}